

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskBuilder.cpp
# Opt level: O0

vector<FormatType_*,_std::allocator<FormatType_*>_> * __thiscall
DiskBuilder::GetFormatsList
          (vector<FormatType_*,_std::allocator<FormatType_*>_> *__return_storage_ptr__,
          DiskBuilder *this,FormatAction action)

{
  bool bVar1;
  int iVar2;
  reference ppFVar3;
  byte local_31;
  iterator iStack_30;
  bool add;
  __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
  local_28;
  iterator it;
  FormatAction action_local;
  DiskBuilder *this_local;
  vector<FormatType_*,_std::allocator<FormatType_*>_> *format_list;
  
  it._M_current._3_1_ = 0;
  it._M_current._4_4_ = action;
  std::vector<FormatType_*,_std::allocator<FormatType_*>_>::vector(__return_storage_ptr__);
  local_28._M_current =
       (FormatType **)
       std::vector<FormatType_*,_std::allocator<FormatType_*>_>::begin(&this->format_list_);
  while( true ) {
    iStack_30 = std::vector<FormatType_*,_std::allocator<FormatType_*>_>::end(&this->format_list_);
    bVar1 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    local_31 = 0;
    if (it._M_current._4_4_ == READ) {
      ppFVar3 = __gnu_cxx::
                __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
                ::operator*(&local_28);
      iVar2 = (*(*ppFVar3)->_vptr_FormatType[3])();
      local_31 = (byte)iVar2 & 1;
    }
    else if (it._M_current._4_4_ == WRITE) {
      ppFVar3 = __gnu_cxx::
                __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
                ::operator*(&local_28);
      iVar2 = (*(*ppFVar3)->_vptr_FormatType[4])();
      local_31 = (byte)iVar2 & 1;
    }
    if (local_31 != 0) {
      ppFVar3 = __gnu_cxx::
                __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
                ::operator*(&local_28);
      std::vector<FormatType_*,_std::allocator<FormatType_*>_>::push_back
                (__return_storage_ptr__,ppFVar3);
    }
    __gnu_cxx::
    __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>::
    operator++(&local_28,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<FormatType*> DiskBuilder::GetFormatsList(DiskBuilder::FormatAction action)
{
   std::vector<FormatType*> format_list;

   for (auto it = format_list_.begin(); it != format_list_.end(); it++)
   {
      bool add = false;
      switch (action)
      {
      case READ:
         add = (*it)->CanLoad();
         break;
      case WRITE:
         add = (*it)->CanSave();
         break;
      }
      if (add)
      {
         format_list.push_back(*it);
      }
   }
   return format_list;
}